

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Option<Catch::AssertionResult>::reset(Option<Catch::AssertionResult> *this)

{
  AssertionResult *pAVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  pAVar1 = this->nullableValue;
  if (pAVar1 != (AssertionResult *)0x0) {
    pcVar2 = (pAVar1->m_resultData).reconstructedExpression._M_dataplus._M_p;
    paVar3 = &(pAVar1->m_resultData).reconstructedExpression.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar3) {
      operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    }
    pcVar2 = (pAVar1->m_resultData).message._M_dataplus._M_p;
    paVar3 = &(pAVar1->m_resultData).message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar3) {
      operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    }
  }
  this->nullableValue = (AssertionResult *)0x0;
  return;
}

Assistant:

void reset() {
            if( nullableValue )
                nullableValue->~T();
            nullableValue = nullptr;
        }